

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSyncTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::egl::anon_unknown_0::CreateInvalidAttribsTest::iterate(CreateInvalidAttribsTest *this)

{
  ostringstream *poVar1;
  EGLenum EVar2;
  TestLog *pTVar3;
  int iVar4;
  Library *pLVar5;
  undefined4 extraout_var;
  size_t sVar6;
  TestError *this_00;
  char *pcVar7;
  qpTestResult testResult;
  TestContext *this_01;
  char *__s;
  EGLint attribs [5];
  Enum<int,_2UL> local_1d8;
  undefined4 local_1c8;
  undefined4 uStack_1c4;
  undefined4 uStack_1c0;
  undefined4 uStack_1bc;
  undefined4 local_1b8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  pLVar5 = EglTestContext::getLibrary((this->super_SyncTest).super_TestCase.m_eglTestCtx);
  pTVar3 = ((this->super_SyncTest).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_1c8 = 2;
  uStack_1c4 = 3;
  uStack_1c0 = 4;
  uStack_1bc = 5;
  local_1b8 = 0x3038;
  iVar4 = (*pLVar5->_vptr_Library[0x11])
                    (pLVar5,(this->super_SyncTest).m_eglDisplay,
                     (ulong)(this->super_SyncTest).m_syncType);
  (this->super_SyncTest).m_sync = (EGLSyncKHR)CONCAT44(extraout_var,iVar4);
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = pTVar3;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::ostream::_M_insert<void_const*>(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," = eglCreateSyncKHR(",0x14);
  std::ostream::_M_insert<void_const*>(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
  EVar2 = (this->super_SyncTest).m_syncType;
  pcVar7 = "<Unknown>";
  if (EVar2 == 0x30fa) {
    pcVar7 = "EGL_SYNC_REUSABLE_KHR";
  }
  __s = "EGL_SYNC_FENCE_KHR";
  if (EVar2 != 0x30f9) {
    __s = pcVar7;
  }
  sVar6 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,__s,sVar6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,", { 2, 3, 4, 5, EGL_NONE })",0x1b);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  iVar4 = (*pLVar5->_vptr_Library[0x1f])(pLVar5);
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = pTVar3;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::ostream::operator<<(poVar1,iVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," = eglGetError()",0x10);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  if (iVar4 == 0x3004) {
    if ((this->super_SyncTest).m_sync != (EGLSyncKHR)0x0) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,(char *)0x0,"m_sync == EGL_NO_SYNC_KHR",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                 ,0x19b);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    this_01 = (this->super_SyncTest).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    pcVar7 = "Pass";
    testResult = QP_TEST_RESULT_PASS;
  }
  else {
    poVar1 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = pTVar3;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Unexpected error \'",0x12)
    ;
    local_1d8.m_getName = eglu::getErrorName;
    local_1d8.m_value = iVar4;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1d8,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"\' expected EGL_BAD_ATTRIBUTE",0x1c);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    this_01 = (this->super_SyncTest).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    pcVar7 = "Fail";
    testResult = QP_TEST_RESULT_FAIL;
  }
  tcu::TestContext::setTestResult(this_01,testResult,pcVar7);
  return STOP;
}

Assistant:

IterateResult	iterate						(void)
	{
		const Library&	egl		= m_eglTestCtx.getLibrary();
		TestLog&		log		= m_testCtx.getLog();

		EGLint attribs[] = {
			2, 3, 4, 5,
			EGL_NONE
		};

		m_sync = egl.createSyncKHR(m_eglDisplay, m_syncType, attribs);
		log << TestLog::Message << m_sync << " = eglCreateSyncKHR(" << m_eglDisplay << ", " << getSyncTypeName(m_syncType) << ", { 2, 3, 4, 5, EGL_NONE })" << TestLog::EndMessage;

		EGLint error = egl.getError();
		log << TestLog::Message << error << " = eglGetError()" << TestLog::EndMessage;

		if (error != EGL_BAD_ATTRIBUTE)
		{
			log << TestLog::Message << "Unexpected error '" << eglu::getErrorStr(error) << "' expected EGL_BAD_ATTRIBUTE" << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
			return STOP;
		}

		TCU_CHECK(m_sync == EGL_NO_SYNC_KHR);

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}